

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-arch.c
# Opt level: O3

void argon2_get_impl_list(argon2_impl_list *list)

{
  cpu_flags_get();
  list->count = 6;
  list->entries = argon2_get_impl_list::IMPLS;
  return;
}

Assistant:

void argon2_get_impl_list(argon2_impl_list *list)
{
    static const argon2_impl IMPLS[] = {
        { "x86_64",     NULL,           fill_segment_default },
        { "SSE2",       check_sse2,     fill_segment_sse2 },
        { "SSSE3",      check_ssse3,    fill_segment_ssse3 },
        { "XOP",        check_xop,      fill_segment_xop },
        { "AVX2",       check_avx2,     fill_segment_avx2 },
        { "AVX-512F",   check_avx512f,  fill_segment_avx512f },
    };

    cpu_flags_get();

    list->count = sizeof(IMPLS) / sizeof(IMPLS[0]);
    list->entries = IMPLS;
}